

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<std::array<float,3ul>>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_float3 *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  Specifier *__lhs;
  PrimVar *this;
  undefined8 uVar1;
  pointer pSVar2;
  ShaderNode *pSVar3;
  string *psVar4;
  __type _Var5;
  bool bVar6;
  int iVar7;
  value_type *pvVar8;
  value_type *value;
  ostream *poVar9;
  size_type sVar10;
  mapped_type *this_00;
  UsdPrimvarReader_float3 *pUVar11;
  long lVar12;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *pvVar14;
  ulong uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  long lVar16;
  UsdPrimvarReader_float3 *pUStackY_600;
  UsdPrimvarReader_float3 *pUVar17;
  allocator local_5e1;
  UsdPrimvarReader_float3 *local_5e0;
  string *local_5d8;
  ParseResult ret;
  optional<std::array<float,_3UL>_> local_598;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_588;
  UsdPrimvarReader_float3 *local_580;
  UsdPrimvarReader_float3 *local_578;
  string local_570;
  optional<tinyusdz::Animatable<std::array<float,3ul>>> *local_550;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_548;
  string *local_540;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_538;
  double local_530;
  string *local_528;
  optional<std::array<float,_3UL>_> pv;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string attr_type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  ostringstream ss_e_1;
  undefined1 local_480 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470 [22];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0;
  optional<tinyusdz::Animatable<std::array<float,_3UL>_>_> av;
  UsdPrimvarReader_float3 *pUVar13;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pUVar13 = preader;
  local_5d8 = err;
  local_540 = warn;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ::std::__cxx11::string::string((string *)&av,"info:id",(allocator *)&ss_e_1);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&av);
  ::std::__cxx11::string::_M_dispose();
  local_578 = (UsdPrimvarReader_float3 *)&(properties->_M_t)._M_impl.super__Rb_tree_header;
  local_538 = &(preader->fallback)._paths;
  local_550 = (optional<tinyusdz::Animatable<std::array<float,3ul>>> *)&(preader->fallback)._attrib;
  local_588 = &preader->varname;
  local_528 = (string *)&preader->result;
  local_548 = &(preader->super_ShaderNode).super_UsdShadePrim.props;
  local_580 = preader;
  for (pUVar11 = (UsdPrimvarReader_float3 *)
                 (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      pUVar11 != local_578;
      pUVar11 = (UsdPrimvarReader_float3 *)::std::_Rb_tree_increment((_Rb_tree_node_base *)pUVar11))
  {
    __lhs = &(pUVar11->super_ShaderNode).super_UsdShadePrim.spec;
    ::std::__cxx11::string::string((string *)&local_4a8,(string *)__lhs);
    local_5e0 = (UsdPrimvarReader_float3 *)
                &(pUVar11->super_ShaderNode).super_UsdShadePrim.meta._kind_str;
    ::std::__cxx11::string::string((string *)&local_570,"inputs:fallback",&local_5e1);
    ret.err._M_dataplus._M_p = (pointer)&ret.err.field_2;
    ret.err._M_string_length = 0;
    ret.err.field_2._M_local_buf[0] = '\0';
    iVar7 = ::std::__cxx11::string::compare((string *)&local_4a8);
    if (iVar7 == 0) {
      if (((undefined1  [32])(pUVar11->super_ShaderNode).super_UsdShadePrim.meta.sceneName.contained
          & (undefined1  [32])0xfffffffe00000000) == (undefined1  [32])0x200000000) {
        ret.code = PropertyTypeMismatch;
        ::std::__cxx11::string::string
                  ((string *)&ss_e_1,
                   "Property `{}` must be Attribute, but declared as Relationship.",
                   (allocator *)&attr_type_name);
        fmt::format<std::__cxx11::string>
                  ((string *)&av,(fmt *)&ss_e_1,&local_570,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pUVar13);
        ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&av);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      if (*(long *)&(pUVar11->super_ShaderNode).super_UsdShadePrim.meta.doc !=
          *(long *)((long)&(pUVar11->super_ShaderNode).super_UsdShadePrim.meta.customData.contained
                   + 0x28)) {
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_538,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   ((long)&(pUVar11->super_ShaderNode).super_UsdShadePrim.meta.customData.contained
                   + 0x28));
        ret.code = Success;
      }
      Attribute::type_name_abi_cxx11_(&attr_type_name,(Attribute *)local_5e0);
      tinyusdz::value::TypeTraits<std::array<float,3ul>>::type_name_abi_cxx11_();
      _Var5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&av,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&attr_type_name);
      if (_Var5) {
        ::std::__cxx11::string::_M_dispose();
LAB_001d2e6d:
        pUVar13 = pUVar11;
        iVar7 = *(int *)((long)&(pUVar13->super_ShaderNode).super_UsdShadePrim.meta.sceneName.
                                contained + 4);
        if (iVar7 == 1) {
          pUVar17 = pUVar13;
          bVar6 = Attribute::is_blocked((Attribute *)local_5e0);
          if (bVar6) {
            (local_580->fallback)._blocked = true;
          }
          this = (PrimVar *)
                 ((long)&(pUVar17->super_ShaderNode).super_UsdShadePrim.meta.assetInfo.contained.
                         data + 0x20);
          pUVar11 = pUVar17;
          bVar6 = primvar::PrimVar::has_value(this);
          if ((bVar6) ||
             (*(long *)((long)&(pUVar17->super_ShaderNode).super_UsdShadePrim.meta.customData.
                               contained + 0x10) !=
              *(long *)((long)&(pUVar17->super_ShaderNode).super_UsdShadePrim.meta.customData.
                               contained + 8))) {
            av.contained._24_1_ = 0;
            av.contained._25_8_ = 0;
            av.contained._8_8_ = 0;
            av.contained._16_1_ = 0;
            av.contained._17_7_ = 0;
            av.contained._0_4_ = 0;
            av.contained._4_2_ = 0;
            av.has_value_ = false;
            av._1_5_ = 0;
            av._6_2_ = 0;
            bVar6 = primvar::PrimVar::is_valid(this);
            if (bVar6) {
              bVar6 = primvar::PrimVar::has_value(this);
              if (bVar6) {
                primvar::PrimVar::get_value<std::array<float,3ul>>(&local_598,this);
                pv.has_value_ = local_598.has_value_;
                if (local_598.has_value_ != true) goto LAB_001d3979;
                pv.contained._8_4_ = local_598.contained._8_4_;
                pv.contained._0_8_ = local_598.contained._0_8_;
                pvVar8 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value(&pv);
                uVar1 = *(undefined8 *)pvVar8->_M_elems;
                av.has_value_ = SUB81(uVar1,0);
                av._1_5_ = SUB85((ulong)uVar1 >> 8,0);
                av._6_2_ = SUB82((ulong)uVar1 >> 0x30,0);
                av.contained._0_4_ = pvVar8->_M_elems[2];
                av.contained._4_2_ = 1;
                pUStackY_600 = *(UsdPrimvarReader_float3 **)
                                ((long)&(pUVar11->super_ShaderNode).super_UsdShadePrim.meta.
                                        customData.contained + 8);
                pUVar13 = *(UsdPrimvarReader_float3 **)
                           ((long)&(pUVar11->super_ShaderNode).super_UsdShadePrim.meta.customData.
                                   contained + 0x10);
                if (pUVar13 != pUStackY_600) goto LAB_001d3999;
              }
              else {
LAB_001d3979:
                pUStackY_600 = *(UsdPrimvarReader_float3 **)
                                ((long)&(pUVar11->super_ShaderNode).super_UsdShadePrim.meta.
                                        customData.contained + 8);
                pUVar13 = *(UsdPrimvarReader_float3 **)
                           ((long)&(pUVar11->super_ShaderNode).super_UsdShadePrim.meta.customData.
                                   contained + 0x10);
                if (pUVar13 == pUStackY_600) {
                  _ss_e_1 = _ss_e_1 & 0xffffff00;
                  local_470[1]._0_8_ = 0;
                  local_470[1]._8_8_ = 0;
                  local_470[0]._0_8_ = 0;
                  local_470[0]._8_8_ = 0;
                  local_480._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                  local_480._8_8_ = 0;
                  pUVar13 = pUStackY_600;
                  goto LAB_001d30be;
                }
LAB_001d3999:
                pSVar3 = &pUVar11->super_ShaderNode;
                lVar16 = 0;
                uVar15 = 0;
                while( true ) {
                  lVar12 = (long)pUVar13 - (long)pUStackY_600;
                  pUStackY_600 = (UsdPrimvarReader_float3 *)0x28;
                  pUVar13 = (UsdPrimvarReader_float3 *)0x28;
                  if ((ulong)(lVar12 / 0x28) <= uVar15) break;
                  pvVar14 = tinyusdz::value::TimeSamples::get_samples
                                      ((TimeSamples *)
                                       ((long)&(pSVar3->super_UsdShadePrim).meta.customData.
                                               contained + 8));
                  pSVar2 = (pvVar14->
                           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  if ((&pSVar2->blocked)[lVar16] == true) {
                    TypedTimeSamples<std::array<float,_3UL>_>::add_blocked_sample
                              ((TypedTimeSamples<std::array<float,_3UL>_> *)
                               ((long)&av.contained + 8),*(double *)((long)&pSVar2->t + lVar16));
                  }
                  else {
                    tinyusdz::value::Value::get_value<std::array<float,3ul>>
                              (&local_598,(Value *)((long)&(pSVar2->value).v_.storage + lVar16),
                               false);
                    pv.has_value_ = local_598.has_value_;
                    if (local_598.has_value_ != true) goto LAB_001d30b9;
                    pv.contained._8_4_ = local_598.contained._8_4_;
                    pv.contained._0_8_ = local_598.contained._0_8_;
                    local_530 = *(double *)((long)&pSVar2->t + lVar16);
                    pvVar8 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value(&pv);
                    TypedTimeSamples<std::array<float,_3UL>_>::add_sample
                              ((TypedTimeSamples<std::array<float,_3UL>_> *)
                               ((long)&av.contained + 8),local_530,pvVar8);
                  }
                  uVar15 = uVar15 + 1;
                  pUStackY_600 = *(UsdPrimvarReader_float3 **)
                                  ((long)&(pUVar11->super_ShaderNode).super_UsdShadePrim.meta.
                                          customData.contained + 8);
                  pUVar13 = *(UsdPrimvarReader_float3 **)
                             ((long)&(pUVar11->super_ShaderNode).super_UsdShadePrim.meta.customData.
                                     contained + 0x10);
                  lVar16 = lVar16 + 0x28;
                }
              }
              nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_3UL>_>_>::
              optional<tinyusdz::Animatable<std::array<float,_3UL>_>,_0>
                        ((optional<tinyusdz::Animatable<std::array<float,_3UL>_>_> *)&ss_e_1,
                         (Animatable<std::array<float,_3UL>_> *)&av);
              pUVar13 = pUStackY_600;
            }
            else {
LAB_001d30b9:
              _ss_e_1 = _ss_e_1 & 0xffffff00;
              local_470[1]._8_8_ = 0;
              local_470[1]._0_8_ = 0;
              local_470[0]._8_8_ = 0;
              local_470[0]._0_8_ = 0;
              local_480._8_8_ = 0;
              local_480._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
            }
LAB_001d30be:
            ::std::
            _Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample>_>
            ::~_Vector_base((_Vector_base<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::Sample>_>
                             *)((long)&av.contained + 8));
            nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_3UL>_>_>::
            optional<tinyusdz::Animatable<std::array<float,_3UL>_>,_0>
                      (&av,(optional<tinyusdz::Animatable<std::array<float,_3UL>_>_> *)&ss_e_1);
            nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_3UL>_>_>::
            ~optional((optional<tinyusdz::Animatable<std::array<float,_3UL>_>_> *)&ss_e_1);
            bVar6 = av.has_value_;
            if (av.has_value_ == true) {
              value = nonstd::optional_lite::
                      optional<tinyusdz::Animatable<std::array<float,_3UL>_>_>::value(&av);
              nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,3ul>>>::
              operator=(local_550,value);
            }
            else {
              ret.code = InternalError;
              ::std::__cxx11::string::assign((char *)&ret.err);
            }
            nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_3UL>_>_>::
            ~optional(&av);
            if (bVar6 == false) goto LAB_001d315b;
            goto LAB_001d313c;
          }
          if (*(long *)&(pUVar17->super_ShaderNode).super_UsdShadePrim.meta.doc ==
              *(long *)((long)&(pUVar17->super_ShaderNode).super_UsdShadePrim.meta.customData.
                               contained + 0x28)) goto LAB_001d315b;
          AttrMetas::operator=
                    (&(preader->fallback)._metas,
                     (AttrMetas *)
                     ((long)&(pUVar11->super_ShaderNode).super_UsdShadePrim.meta.doc.contained + 8))
          ;
          __v = &local_4a8;
        }
        else {
          pUVar11 = pUVar13;
          if (iVar7 != 0) {
            ::std::__cxx11::string::assign((char *)&ret.err);
            ret.code = InternalError;
            goto LAB_001d315b;
          }
          (local_580->fallback)._value_empty = true;
LAB_001d313c:
          __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_570;
          AttrMetas::operator=
                    (&(preader->fallback)._metas,
                     (AttrMetas *)
                     ((long)&(pUVar11->super_ShaderNode).super_UsdShadePrim.meta.doc.contained + 8))
          ;
        }
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&table,__v);
        ret.code = Success;
      }
      else {
        tinyusdz::value::TypeTraits<std::array<float,3ul>>::underlying_type_name_abi_cxx11_();
        _Var5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&ss_e_1,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&attr_type_name);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (_Var5) goto LAB_001d2e6d;
        ret.code = TypeMismatch;
        ::std::__cxx11::stringstream::stringstream((stringstream *)&av);
        poVar9 = ::std::operator<<((ostream *)((long)&av.contained + 8),"Property type mismatch. ");
        poVar9 = ::std::operator<<(poVar9,(string *)&local_570);
        poVar9 = ::std::operator<<(poVar9," expects type `");
        tinyusdz::value::TypeTraits<std::array<float,3ul>>::type_name_abi_cxx11_();
        poVar9 = ::std::operator<<(poVar9,(string *)&ss_e_1);
        poVar9 = ::std::operator<<(poVar9,"` but defined as type `");
        poVar9 = ::std::operator<<(poVar9,(string *)&attr_type_name);
        ::std::operator<<(poVar9,"`");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&ss_e_1);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringstream::~stringstream((stringstream *)&av);
      }
LAB_001d315b:
      ::std::__cxx11::string::_M_dispose();
    }
    else {
      ret.code = Unmatched;
    }
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    iVar7 = 0;
    if ((ret.code & ~AlreadyProcessed) == Success) {
      iVar7 = 3;
LAB_001d32b9:
      bVar6 = false;
    }
    else {
      bVar6 = true;
      if (ret.code != Unmatched) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&av);
        poVar9 = ::std::operator<<((ostream *)&av,"[error]");
        poVar9 = ::std::operator<<(poVar9,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar9 = ::std::operator<<(poVar9,":");
        poVar9 = ::std::operator<<(poVar9,"ReconstructShader");
        poVar9 = ::std::operator<<(poVar9,"():");
        poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x10b9);
        ::std::operator<<(poVar9," ");
        ::std::__cxx11::string::string
                  ((string *)&attr_type_name,"Parsing attribute `{}` failed. Error: {}",
                   (allocator *)&local_570);
        pUVar13 = (UsdPrimvarReader_float3 *)&ret.err;
        fmt::format<char[16],std::__cxx11::string>
                  ((string *)&ss_e_1,(fmt *)&attr_type_name,(string *)"inputs:fallback",
                   (char (*) [16])pUVar13,warn);
        poVar9 = ::std::operator<<((ostream *)&av,(string *)&ss_e_1);
        ::std::operator<<(poVar9,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        psVar4 = local_5d8;
        if (local_5d8 != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&attr_type_name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar4);
          ::std::__cxx11::string::operator=((string *)psVar4,(string *)&ss_e_1);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&av);
        iVar7 = 1;
        goto LAB_001d32b9;
      }
    }
    ::std::__cxx11::string::_M_dispose();
    if (bVar6) {
      bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"inputs:varname");
      if (bVar6) {
        ::std::__cxx11::string::string((string *)&av,"inputs:varname",(allocator *)&ss_e_1);
        sVar10 = ::std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count(&table,(key_type *)&av);
        ::std::__cxx11::string::_M_dispose();
        if (sVar10 == 0) {
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::TypedAttribute
                    ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&av);
          ::std::__cxx11::string::string((string *)&local_2d0,(string *)__lhs);
          ::std::__cxx11::string::string
                    ((string *)&ss_e_1,"inputs:varname",(allocator *)&attr_type_name);
          pUVar13 = local_5e0;
          warn = (string *)&ss_e_1;
          anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                    (&ret,&table,&local_2d0,(Property *)local_5e0,(string *)&ss_e_1,
                     (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&av);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (ret.code == TypeMismatch) {
            ::std::__cxx11::string::string(local_2f0,(string *)__lhs);
            ::std::__cxx11::string::string
                      ((string *)&ss_e_1,"inputs:varname",(allocator *)&local_570);
            pUVar13 = local_5e0;
            warn = (string *)&ss_e_1;
            (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                      ((ParseResult *)&attr_type_name,(_anonymous_namespace_ *)&table,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2f0,(string *)local_5e0,(Property *)&ss_e_1,(string *)local_588,
                       (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)pUVar11);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            iVar7 = 3;
            if ((int)attr_type_name._M_dataplus._M_p != 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
              poVar9 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
              poVar9 = ::std::operator<<(poVar9,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar9 = ::std::operator<<(poVar9,":");
              poVar9 = ::std::operator<<(poVar9,"ReconstructShader");
              poVar9 = ::std::operator<<(poVar9,"():");
              poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x10d2);
              ::std::operator<<(poVar9," ");
              ::std::__cxx11::string::string
                        ((string *)&pv,"Faied to parse inputs:varname: {}",(allocator *)&local_598);
              fmt::format<std::__cxx11::string>
                        (&local_570,(fmt *)&pv,(string *)&attr_type_name._M_string_length,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pUVar13);
              poVar9 = ::std::operator<<((ostream *)&ss_e_1,(string *)&local_570);
              ::std::operator<<(poVar9,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              psVar4 = local_5d8;
              if (local_5d8 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+(&local_570,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&pv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)psVar4);
                ::std::__cxx11::string::operator=((string *)psVar4,(string *)&local_570);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
              iVar7 = 1;
            }
            ::std::__cxx11::string::_M_dispose();
          }
          else {
            iVar7 = 0;
            if (ret.code == Success) {
              bVar6 = ConvertTokenAttributeToStringAttribute
                                ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&av,
                                 local_588);
              iVar7 = 3;
              if (!bVar6) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
                poVar9 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
                poVar9 = ::std::operator<<(poVar9,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar9 = ::std::operator<<(poVar9,":");
                poVar9 = ::std::operator<<(poVar9,"ReconstructShader");
                poVar9 = ::std::operator<<(poVar9,"():");
                poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x10c0);
                ::std::operator<<(poVar9," ");
                poVar9 = ::std::operator<<((ostream *)&ss_e_1,
                                           "Failed to convert inputs:varname token type to string type."
                                          );
                ::std::operator<<(poVar9,"\n");
                psVar4 = local_5d8;
                if (local_5d8 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&attr_type_name,&local_570,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)psVar4);
                  ::std::__cxx11::string::operator=((string *)psVar4,(string *)&attr_type_name);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
                iVar7 = 1;
              }
            }
          }
          ::std::__cxx11::string::_M_dispose();
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::~TypedAttribute
                    ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&av);
          if (iVar7 != 0) goto LAB_001d395b;
        }
      }
      ::std::__cxx11::string::string(local_310,(string *)__lhs);
      ::std::__cxx11::string::string((string *)&av,"outputs:result",(allocator *)&ret);
      pUVar13 = local_5e0;
      warn = (string *)&av;
      (anonymous_namespace)::ParseShaderOutputTerminalAttribute<std::array<float,3ul>>
                ((ParseResult *)&ss_e_1,(_anonymous_namespace_ *)&table,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_310,(string *)local_5e0,(Property *)&av,local_528,
                 (TypedTerminalAttribute<std::array<float,_3UL>_> *)pUVar11);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar7 = 0;
      if ((_ss_e_1 & 0xfffffffd) == 0) {
        iVar7 = 3;
LAB_001d34bc:
        bVar6 = false;
      }
      else {
        bVar6 = true;
        if (_ss_e_1 != 1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&av);
          poVar9 = ::std::operator<<((ostream *)&av,"[error]");
          poVar9 = ::std::operator<<(poVar9,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar9 = ::std::operator<<(poVar9,":");
          poVar9 = ::std::operator<<(poVar9,"ReconstructShader");
          poVar9 = ::std::operator<<(poVar9,"():");
          poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x10d8);
          ::std::operator<<(poVar9," ");
          ::std::__cxx11::string::string
                    ((string *)&attr_type_name,
                     "Parsing shader output property `{}` failed. Error: {}",(allocator *)&local_570
                    );
          pUVar13 = (UsdPrimvarReader_float3 *)local_480;
          fmt::format<char[15],std::__cxx11::string>
                    ((string *)&ret,(fmt *)&attr_type_name,(string *)"outputs:result",
                     (char (*) [15])pUVar13,warn);
          poVar9 = ::std::operator<<((ostream *)&av,(string *)&ret);
          ::std::operator<<(poVar9,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar4 = local_5d8;
          if (local_5d8 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&attr_type_name,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar4);
            ::std::__cxx11::string::operator=((string *)psVar4,(string *)&ret);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&av);
          iVar7 = 1;
          goto LAB_001d34bc;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (!bVar6) goto LAB_001d395b;
      sVar10 = ::std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::count(&table,(key_type *)__lhs);
      if (sVar10 == 0) {
        this_00 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                  ::operator[](local_548,(key_type *)__lhs);
        Property::operator=(this_00,(Property *)local_5e0);
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&table,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs);
      }
      sVar10 = ::std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::count(&table,(key_type *)__lhs);
      if (sVar10 == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&av);
        poVar9 = ::std::operator<<((ostream *)&av,"[warn]");
        poVar9 = ::std::operator<<(poVar9,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar9 = ::std::operator<<(poVar9,":");
        poVar9 = ::std::operator<<(poVar9,"ReconstructShader");
        poVar9 = ::std::operator<<(poVar9,"():");
        poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0x10da);
        ::std::operator<<(poVar9," ");
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &ss_e_1,"Unsupported/unimplemented property: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs)
        ;
        poVar9 = ::std::operator<<((ostream *)&av,(string *)&ss_e_1);
        ::std::operator<<(poVar9,"\n");
        ::std::__cxx11::string::_M_dispose();
        psVar4 = local_540;
        if (local_540 != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_5d8);
          ::std::__cxx11::string::operator=((string *)psVar4,(string *)&ss_e_1);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&av);
      }
    }
    else {
LAB_001d395b:
      if ((iVar7 != 3) && (iVar7 != 0)) break;
    }
  }
  bVar6 = pUVar11 == local_578;
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return bVar6;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_float3>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_float3 *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>
  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_float3,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_float3, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_float3, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}